

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O3

void __thiscall helics::FilterFederate::handleMessage(FilterFederate *this,ActionMessage *command)

{
  TimeCoordinator *timeCoord;
  BaseType BVar1;
  action_t aVar2;
  uint uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  size_type __len2;
  GlobalHandle filt;
  GlobalHandle targetId;
  tuple<helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_> tVar4;
  ulong *puVar5;
  uint __val;
  _func_void__Op_any_ptr__Arg_ptr *p_Var6;
  _Storage _Var7;
  undefined8 __len1;
  uint uVar8;
  FederateStates FVar9;
  bool bVar10;
  int iVar11;
  FilterInfo *pFVar12;
  AirLock<std::any,_std::mutex,_std::condition_variable> *this_01;
  FilterCoordinator *this_02;
  char *__s;
  size_t __len2_00;
  const_iterator cVar13;
  __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
  _Var14;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *this_03;
  BasicHandleInfo *pBVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  uint uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong uVar19;
  GlobalFederateId fedID;
  ulong *puVar20;
  uint __len;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> proc_result;
  ActionMessage disconnect;
  int in_stack_fffffffffffffecc;
  helics local_12b;
  char local_12a;
  FederateStates local_129;
  any local_128;
  element_type local_118;
  undefined8 uStack_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [10];
  
  timeCoord = &this->mCoord;
  processCoordinatorMessage
            (&local_12b,command,timeCoord,this->current_state,false,
             (GlobalFederateId)(this->mFedID).gid);
  FVar9 = this->current_state;
  if ((FVar9 == EXECUTING & (byte)local_12b) == 1) {
    BaseTimeCoordinator::disconnect(&timeCoord->super_BaseTimeCoordinator);
    ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_disconnect);
    local_e8._8_4_ = (this->mFedID).gid;
    local_d8[0]._M_allocated_capacity = (ulong)(uint)local_d8[0]._4_4_ << 0x20;
    if ((this->mQueueMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->mQueueMessage)._M_invoker)((_Any_data *)&this->mQueueMessage,(ActionMessage *)local_e8)
    ;
    ActionMessage::~ActionMessage((ActionMessage *)local_e8);
    FVar9 = this->current_state;
  }
  if (FVar9 != local_129) {
    this->current_state = local_129;
    if (local_129 == ERRORED) {
      local_e8._0_8_ = local_d8;
      local_e8._8_8_ = (_Storage)0x0;
      local_d8[0]._M_allocated_capacity = local_d8[0]._M_allocated_capacity & 0xffffffffffffff00;
      __len2 = (command->payload).bufferSize;
      if (__len2 == 0) {
        __s = commandErrorString(in_stack_fffffffffffffecc);
        __len1 = local_e8._8_8_;
        __len2_00 = strlen(__s);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,0,
                   __len1,__s,__len2_00);
        iVar11 = CLI::std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_e8,"unknown");
        if (iVar11 == 0) {
          uVar3 = command->messageID;
          __val = -uVar3;
          if (0 < (int)uVar3) {
            __val = uVar3;
          }
          __len = 1;
          if (9 < __val) {
            uVar19 = (ulong)__val;
            uVar8 = 4;
            do {
              __len = uVar8;
              uVar17 = (uint)uVar19;
              if (uVar17 < 100) {
                __len = __len - 2;
                goto LAB_0030c5aa;
              }
              if (uVar17 < 1000) {
                __len = __len - 1;
                goto LAB_0030c5aa;
              }
              if (uVar17 < 10000) goto LAB_0030c5aa;
              uVar19 = uVar19 / 10000;
              uVar8 = __len + 4;
            } while (99999 < uVar17);
            __len = __len + 1;
          }
LAB_0030c5aa:
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_108,(ulong)(-((int)uVar3 >> 0x1f) + __len),'-');
          CLI::std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_108._M_dataplus._M_p + (uint)-((int)uVar3 >> 0x1f),__len,__val);
          pbVar16 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                              (&local_108,0,0," code:",6);
          local_128._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)(pbVar16->_M_dataplus)._M_p;
          paVar18 = &pbVar16->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_manager == paVar18) {
            local_118._vptr_FilterOperator = (_func_int **)paVar18->_M_allocated_capacity;
            uStack_110 = *(undefined8 *)((long)&pbVar16->field_2 + 8);
            local_128._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)&local_118;
          }
          else {
            local_118._vptr_FilterOperator = (_func_int **)paVar18->_M_allocated_capacity;
          }
          local_128._M_storage = (_Storage)pbVar16->_M_string_length;
          (pbVar16->_M_dataplus)._M_p = (pointer)paVar18;
          pbVar16->_M_string_length = 0;
          (pbVar16->field_2)._M_local_buf[0] = '\0';
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                    (char *)local_128._M_manager,(size_type)local_128._M_storage);
          if ((element_type *)local_128._M_manager != &local_118) {
            operator_delete(local_128._M_manager,(long)local_118._vptr_FilterOperator + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,0,0
                   ,(char *)(command->payload).heap,__len2);
      }
      if ((this->mLogger).super__Function_base._M_manager != (_Manager_type)0x0) {
        __args_1._M_str = (this->mName)._M_dataplus._M_p;
        __args_1._M_len = (this->mName)._M_string_length;
        __args_2._M_str = (char *)local_e8._0_8_;
        __args_2._M_len = local_e8._8_8_;
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()(&this->mLogger,0,__args_1,__args_2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._0_8_ != local_d8) {
        operator_delete((void *)local_e8._0_8_,local_d8[0]._M_allocated_capacity + 1);
      }
    }
    else if (local_129 == EXECUTING) {
      TimeCoordinator::timeRequest
                (timeCoord,(Time)0x7fffffffffffffff,NO_ITERATIONS,(Time)0x7fffffffffffffff,
                 (Time)0x7fffffffffffffff);
    }
    else if (local_129 == INITIALIZING) {
      TimeCoordinator::enteringExecMode(timeCoord,NO_ITERATIONS);
      ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_exec_check);
      BVar1 = (this->mFedID).gid;
      local_d8[0]._0_4_ = BVar1;
      local_e8._8_4_ = BVar1;
      handleMessage(this,(ActionMessage *)local_e8);
      ActionMessage::~ActionMessage((ActionMessage *)local_e8);
    }
  }
  if (local_12a != -2) {
    if (local_12a != '\b') {
      return;
    }
    if ((command->dest_id).gid == (this->mFedID).gid) {
      handleMessage(this,command);
      return;
    }
    if ((this->mSendMessage).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->mSendMessage)._M_invoker)((_Any_data *)&this->mSendMessage,command);
      return;
    }
LAB_0030c6e7:
    std::__throw_bad_function_call();
  }
  aVar2 = command->messageAction;
  if (aVar2 < cmd_remove_endpoint) {
    if (aVar2 < cmd_close_interface) {
      if (aVar2 != cmd_disconnect) {
        if (aVar2 != cmd_add_endpoint) {
          return;
        }
        pFVar12 = getFilterInfo(this,(GlobalFederateId)(this->mFedID).gid,
                                (InterfaceHandle)(command->dest_handle).hid);
        if (pFVar12 != (FilterInfo *)0x0) {
          if ((command->flags & 2) == 0) {
            this_03 = &pFVar12->sourceTargets;
          }
          else {
            this_03 = &pFVar12->destTargets;
          }
          local_e8._0_8_ = *(undefined8 *)&command->source_id;
          std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::
          emplace_back<helics::GlobalHandle>(this_03,(GlobalHandle *)local_e8);
          if (((command->flags & 0x10) == 0) && (this->usingGlobalTime == false)) {
            fedID.gid = (command->source_id).gid;
            goto LAB_0030c569;
          }
        }
        goto LAB_0030c571;
      }
      if (this->usingGlobalTime != false) {
        return;
      }
      bVar10 = BaseTimeCoordinator::hasActiveTimeDependencies(&timeCoord->super_BaseTimeCoordinator)
      ;
      if (bVar10) {
        return;
      }
      BaseTimeCoordinator::disconnect(&timeCoord->super_BaseTimeCoordinator);
      ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_disconnect);
      local_e8._8_4_ = (this->mFedID).gid;
      local_d8[0]._M_allocated_capacity = local_d8[0]._M_allocated_capacity & 0xffffffff00000000;
      if ((this->mQueueMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->mQueueMessage)._M_invoker)
                ((_Any_data *)&this->mQueueMessage,(ActionMessage *)local_e8);
    }
    else {
      if (aVar2 != cmd_close_interface) {
        if (aVar2 != cmd_remove_filter) {
          return;
        }
        this_02 = getFilterCoordinator(this,(InterfaceHandle)(command->dest_handle).hid);
        if (this_02 == (FilterCoordinator *)0x0) {
          return;
        }
        filt.fed_id.gid = (command->source_id).gid;
        filt.handle.hid = (command->source_handle).hid;
        FilterCoordinator::closeFilter(this_02,filt);
        return;
      }
      local_e8._0_8_ = *(undefined8 *)&command->source_id;
      cVar13 = std::
               _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&(this->filters).lookup._M_h,(key_type *)local_e8);
      if (cVar13.
          super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>.
          _M_cur == (__node_type *)0x0) {
        return;
      }
      tVar4.super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>.
      super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_> *)
            &(this->filters).dataStorage.
             super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start
             [*(long *)((long)cVar13.
                              super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>
                              ._M_cur + 0x10)]._M_t.
             super___uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>;
      if (tVar4.
          super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>.
          super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl ==
          (_Head_base<0UL,_helics::FilterInfo_*,_false>)0x0) {
        return;
      }
      ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_remove_filter);
      local_e8._8_8_ =
           *(undefined8 *)
            tVar4.
            super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>.
            super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl;
      puVar20 = *(ulong **)
                 ((long)tVar4.
                        super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                        .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x68);
      puVar5 = *(ulong **)
                ((long)tVar4.
                       super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                       .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x70);
      if (puVar20 != puVar5) {
        do {
          local_d8[0]._0_8_ = *puVar20;
          if ((this->mSendMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
            std::__throw_bad_function_call();
          }
          (*(this->mSendMessage)._M_invoker)
                    ((_Any_data *)&this->mSendMessage,(ActionMessage *)local_e8);
          puVar20 = puVar20 + 1;
        } while (puVar20 != puVar5);
      }
      puVar20 = *(ulong **)
                 ((long)tVar4.
                        super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                        .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x80);
      puVar5 = *(ulong **)
                ((long)tVar4.
                       super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                       .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x88);
      if (puVar20 != puVar5) {
        do {
          _Var14 = std::
                   __find_if<__gnu_cxx::__normal_iterator<helics::GlobalHandle*,std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>>,__gnu_cxx::__ops::_Iter_equals_val<helics::GlobalHandle_const>>
                             (*(undefined8 *)
                               ((long)tVar4.
                                      super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                                      .super__Head_base<0UL,_helics::FilterInfo_*,_false>.
                                      _M_head_impl + 0x68),
                              *(undefined8 *)
                               ((long)tVar4.
                                      super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                                      .super__Head_base<0UL,_helics::FilterInfo_*,_false>.
                                      _M_head_impl + 0x70),puVar20);
          if (_Var14._M_current !=
              *(GlobalHandle **)
               ((long)tVar4.
                      super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                      .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x70)) {
            local_d8[0]._0_8_ = *puVar20;
            if ((this->mSendMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            (*(this->mSendMessage)._M_invoker)
                      ((_Any_data *)&this->mSendMessage,(ActionMessage *)local_e8);
          }
          puVar20 = puVar20 + 1;
        } while (puVar20 != puVar5);
      }
      if (*(long *)((long)tVar4.
                          super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                          .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x70)
          != *(long *)((long)tVar4.
                             super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                             .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x68
                      )) {
        *(long *)((long)tVar4.
                        super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                        .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x70) =
             *(long *)((long)tVar4.
                             super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                             .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x68
                      );
      }
      if (*(long *)((long)tVar4.
                          super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                          .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x88)
          != *(long *)((long)tVar4.
                             super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                             .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x80
                      )) {
        *(long *)((long)tVar4.
                        super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                        .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x88) =
             *(long *)((long)tVar4.
                             super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                             .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x80
                      );
      }
      *(byte *)((long)tVar4.
                      super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                      .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x9b) =
           *(byte *)((long)tVar4.
                           super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                           .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl + 0x9b)
           | 0x10;
    }
    ActionMessage::~ActionMessage((ActionMessage *)local_e8);
  }
  else {
    if (aVar2 < cmd_reg_filter) {
      if (aVar2 == cmd_remove_endpoint) {
        local_e8._0_8_ = *(undefined8 *)&command->dest_id;
        cVar13 = std::
                 _Hashtable<helics::GlobalHandle,_std::pair<const_helics::GlobalHandle,_unsigned_long>,_std::allocator<std::pair<const_helics::GlobalHandle,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<helics::GlobalHandle>,_std::hash<helics::GlobalHandle>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find(&(this->filters).lookup._M_h,(key_type *)local_e8);
        if (cVar13.
            super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>.
            _M_cur == (__node_type *)0x0) {
          return;
        }
        tVar4.super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
        .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_> *)
              &(this->filters).dataStorage.
               super__Vector_base<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>,_std::allocator<std::unique_ptr<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [*(long *)((long)cVar13.
                                super__Node_iterator_base<std::pair<const_helics::GlobalHandle,_unsigned_long>,_false>
                                ._M_cur + 0x10)]._M_t.
               super___uniq_ptr_impl<helics::FilterInfo,_std::default_delete<helics::FilterInfo>_>;
        if (tVar4.
            super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>.
            super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl ==
            (_Head_base<0UL,_helics::FilterInfo_*,_false>)0x0) {
          return;
        }
        targetId.fed_id.gid = (command->source_id).gid;
        targetId.handle.hid = (command->source_handle).hid;
        FilterInfo::removeTarget
                  ((FilterInfo *)
                   tVar4.
                   super__Tuple_impl<0UL,_helics::FilterInfo_*,_std::default_delete<helics::FilterInfo>_>
                   .super__Head_base<0UL,_helics::FilterInfo_*,_false>._M_head_impl,targetId);
        return;
      }
      if (aVar2 != cmd_core_configure) {
        return;
      }
      if (command->messageID != 0x23c) {
        return;
      }
      pFVar12 = getFilterInfo(this,(GlobalFederateId)(this->mFedID).gid,
                              (InterfaceHandle)(command->source_handle).hid);
      if (pFVar12 == (FilterInfo *)0x0) {
        return;
      }
      local_128._M_manager =
           (_func_void__Op_any_ptr__Arg_ptr *)
           CONCAT44(local_128._M_manager._4_4_,(uint)command->counter);
      if ((this->mGetAirLock).super__Function_base._M_manager != (_Manager_type)0x0) {
        this_01 = (*(this->mGetAirLock)._M_invoker)
                            ((_Any_data *)&this->mGetAirLock,(int *)&local_128);
        gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
                  ((optional<std::any> *)local_e8,this_01);
        if ((bool)local_d8[0]._0_1_ == true) {
          std::any_cast<std::shared_ptr<helics::FilterOperator>>(&local_128);
          _Var7 = local_128._M_storage;
          p_Var6 = local_128._M_manager;
          local_128._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
          local_128._M_storage._M_ptr = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = (pFVar12->filterOp).
                    super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          (pFVar12->filterOp).super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)p_Var6;
          (pFVar12->filterOp).super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var7;
          if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_storage._M_ptr !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_storage._M_ptr);
          }
        }
        if ((local_d8[0]._0_1_ & 1) == 0) {
          return;
        }
        std::_Optional_payload_base<std::any>::_M_destroy
                  ((_Optional_payload_base<std::any> *)local_e8);
        return;
      }
      goto LAB_0030c6e7;
    }
    if (aVar2 == cmd_reg_filter) {
      processFilterInfo(this,command);
      return;
    }
    if (aVar2 != cmd_reg_end) {
      return;
    }
    pFVar12 = getFilterInfo(this,(GlobalFederateId)(this->mFedID).gid,
                            (InterfaceHandle)(command->dest_handle).hid);
    if (pFVar12 != (FilterInfo *)0x0) {
      std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
      emplace_back<helics::GlobalFederateId&,helics::InterfaceHandle&>
                ((vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>> *)
                 &pFVar12->sourceTargets,&command->source_id,&command->source_handle);
      if (this->usingGlobalTime == false) {
        fedID.gid = (command->source_id).gid;
LAB_0030c569:
        TimeCoordinator::addDependency(timeCoord,fedID);
      }
    }
LAB_0030c571:
    pBVar15 = HandleManager::getInterfaceHandle
                        (this->mHandles,(InterfaceHandle)(command->dest_handle).hid,FILTER);
    if (pBVar15 != (BasicHandleInfo *)0x0) {
      pBVar15->used = true;
    }
  }
  return;
}

Assistant:

void FilterFederate::handleMessage(ActionMessage& command)
{
    auto proc_result = processCoordinatorMessage(command, &mCoord, current_state, false, mFedID);

    if (std::get<2>(proc_result) && current_state == FederateStates::EXECUTING) {
        mCoord.disconnect();
        ActionMessage disconnect(CMD_DISCONNECT);
        disconnect.source_id = mFedID;
        disconnect.dest_id = parent_broker_id;
        mQueueMessage(disconnect);
    }
    if (current_state != std::get<0>(proc_result)) {
        current_state = std::get<0>(proc_result);
        switch (current_state) {
            case FederateStates::INITIALIZING:
                mCoord.enteringExecMode(IterationRequest::NO_ITERATIONS);
                {
                    ActionMessage echeck{CMD_EXEC_CHECK};
                    echeck.dest_id = mFedID;
                    echeck.source_id = mFedID;
                    handleMessage(echeck);
                }
                break;
            case FederateStates::EXECUTING:
                mCoord.timeRequest(cBigTime, IterationRequest::NO_ITERATIONS, cBigTime, cBigTime);
                break;
            case FederateStates::FINISHED:
                break;
            case FederateStates::ERRORED: {
                std::string errorString;
                if (command.payload.empty()) {
                    errorString = commandErrorString(command.messageID);
                    if (errorString == "unknown") {
                        errorString += " code:" + std::to_string(command.messageID);
                    }
                } else {
                    errorString = command.payload.to_string();
                }
                if (mLogger) {
                    mLogger(HELICS_LOG_LEVEL_ERROR, mName, errorString);
                }
            } break;
            default:
                break;
        }
    }

    switch (std::get<1>(proc_result)) {
        case MessageProcessingResult::CONTINUE_PROCESSING:
            break;
        case MessageProcessingResult::REPROCESS_MESSAGE:
            if (command.dest_id != mFedID) {
                mSendMessage(command);
                return;
            }
            return handleMessage(command);
        case MessageProcessingResult::DELAY_MESSAGE:
        default:
            return;
    }
    switch (command.action()) {
        case CMD_CLOSE_INTERFACE: {
            auto* filt = filters.find(command.getSource());
            if (filt != nullptr) {
                ActionMessage rem(CMD_REMOVE_FILTER);
                rem.source_handle = filt->handle;
                rem.source_id = filt->core_id;
                for (auto& target : filt->sourceTargets) {
                    rem.setDestination(target);
                    mSendMessage(rem);
                }
                for (auto& target : filt->destTargets) {
                    if (std::find(filt->sourceTargets.begin(), filt->sourceTargets.end(), target) !=
                        filt->sourceTargets.end()) {
                        rem.setDestination(target);
                        mSendMessage(rem);
                    }
                }
                filt->sourceTargets.clear();
                filt->destTargets.clear();
                setActionFlag(*filt, disconnected_flag);
            }
        } break;
        case CMD_REMOVE_FILTER: {
            auto* filterC = getFilterCoordinator(command.dest_handle);
            if (filterC == nullptr) {
                return;
            }
            filterC->closeFilter(command.getSource());
        } break;
        case CMD_REMOVE_ENDPOINT: {
            auto* filtI = getFilterInfo(command.getDest());
            if (filtI != nullptr) {
                filtI->removeTarget(command.getSource());
            }
        } break;
        case CMD_REG_ENDPOINT: {
            auto* filtI = getFilterInfo(mFedID, command.dest_handle);
            if (filtI != nullptr) {
                filtI->sourceTargets.emplace_back(command.source_id, command.source_handle);
                if (!usingGlobalTime) {
                    mCoord.addDependency(command.source_id);
                }
            }
            auto* filthandle =
                mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::FILTER);
            if (filthandle != nullptr) {
                filthandle->used = true;
            }
        } break;
        case CMD_DISCONNECT:
            if (!usingGlobalTime && !mCoord.hasActiveTimeDependencies()) {
                mCoord.disconnect();
                ActionMessage disconnect(CMD_DISCONNECT);
                disconnect.source_id = mFedID;
                disconnect.dest_id = parent_broker_id;
                mQueueMessage(disconnect);
            }
            break;
        case CMD_REG_FILTER:
            processFilterInfo(command);
            break;
        case CMD_ADD_ENDPOINT: {
            auto* filtI = getFilterInfo(mFedID, command.dest_handle);
            if (filtI != nullptr) {
                if (checkActionFlag(command, destination_target)) {
                    filtI->destTargets.emplace_back(command.getSource());
                } else {
                    filtI->sourceTargets.emplace_back(command.getSource());
                }
                if (!checkActionFlag(command, error_flag)) {
                    if (!usingGlobalTime) {
                        mCoord.addDependency(command.source_id);
                    }
                }
            }

            auto* filthandle =
                mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::FILTER);
            if (filthandle != nullptr) {
                filthandle->used = true;
            }
        } break;
        case CMD_CORE_CONFIGURE:
            if (command.messageID == UPDATE_FILTER_OPERATOR) {
                auto* filtI = getFilterInfo(mFedID, command.source_handle);
                if (filtI != nullptr) {
                    auto op = mGetAirLock(command.counter).try_unload();
                    if (op) {
                        auto M = std::any_cast<std::shared_ptr<FilterOperator>>(std::move(*op));
                        filtI->filterOp = std::move(M);
                    }
                }
            }
            break;
        default:
            break;
    }
}